

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O2

uint32_t * FastPForLib::__fastunpack18_16(uint32_t *in,uint32_t *out)

{
  uint32_t uVar1;
  uint uVar2;
  ulong uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar16 [16];
  undefined1 auVar15 [32];
  
  uVar1 = in[1];
  auVar8._8_8_ = *(undefined8 *)(in + 2);
  auVar8._0_8_ = *(undefined8 *)(in + 2);
  auVar9 = *(undefined1 (*) [16])in;
  uVar3 = *(ulong *)(in + 4);
  *out = *in & 0x3ffff;
  auVar8 = vpshufd_avx(auVar8,0x50);
  auVar8 = vpsllvd_avx2(auVar8,_DAT_0019df50);
  auVar4 = vpshufd_avx(auVar9,0xa4);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = uVar3;
  auVar12 = vpsllvd_avx2(auVar16,_DAT_0019df60);
  auVar10 = vpbroadcastd_avx512vl();
  uVar2 = in[8];
  auVar8 = vpblendd_avx2(auVar8,ZEXT416(uVar1 << 0xe),1);
  auVar13 = vpsrld_avx(auVar9,0x1e);
  auVar8 = vpand_avx(auVar8,_DAT_00191340);
  auVar9 = vpalignr_avx(auVar12,auVar9,8);
  auVar5 = vpmovsxbd_avx2(ZEXT816(0x50303010100));
  auVar11._0_16_ = ZEXT116(0) * auVar9 + ZEXT116(1) * auVar4;
  auVar11._16_16_ = ZEXT116(1) * auVar9;
  auVar14._8_4_ = 0x3ffff;
  auVar14._0_8_ = 0x3ffff0003ffff;
  auVar14._12_4_ = 0x3ffff;
  auVar15._16_4_ = 0x3ffff;
  auVar15._0_16_ = auVar14;
  auVar15._20_4_ = 0x3ffff;
  auVar15._24_4_ = 0x3ffff;
  auVar15._28_4_ = 0x3ffff;
  auVar9 = vpblendd_avx2(auVar8,auVar13,8);
  auVar6 = vpmovzxdq_avx2(auVar9);
  auVar5 = vpermd_avx2(auVar5,auVar11);
  auVar7 = vpsrlvd_avx2(auVar5,_DAT_0019ec60);
  auVar5._8_8_ = 0x300000003fffc;
  auVar5._0_8_ = 0x300000003fffc;
  auVar5._16_8_ = 0x300000003fffc;
  auVar5._24_8_ = 0x300000003fffc;
  auVar11 = vpandq_avx512vl(auVar11,auVar5);
  auVar5 = vpblendd_avx2(auVar6,auVar10,0x80);
  auVar6 = vpblendd_avx2(auVar7,auVar11,0xc0);
  auVar6 = vpor_avx2(auVar6,auVar5);
  auVar5 = vpand_avx2(auVar7,auVar15);
  auVar9 = vpmovsxbd_avx(ZEXT416(0x1000005));
  auVar5 = vpblendd_avx2(auVar6,auVar5,0x2a);
  *(undefined1 (*) [32])(out + 1) = auVar5;
  out[9] = (uint)(uVar3 >> 0x22) & 0x3ffff;
  uVar3 = *(ulong *)(in + 6);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = uVar3;
  auVar8 = vpsllvd_avx2(auVar12,_DAT_00193210);
  auVar4._8_8_ = 0x3ff000003f000;
  auVar4._0_8_ = 0x3ff000003f000;
  auVar8 = vpandq_avx512vl(auVar8,auVar4);
  auVar9 = vpermi2d_avx512vl(auVar9,auVar12,auVar16);
  auVar4 = vpsrlvd_avx2(auVar9,_DAT_00191370);
  auVar9 = vpmovzxdq_avx(auVar8);
  auVar8 = vpor_avx(auVar4,auVar9);
  auVar9 = vpand_avx(auVar4,auVar14);
  auVar9 = vpblendd_avx2(auVar8,auVar9,10);
  *(undefined1 (*) [16])(out + 10) = auVar9;
  out[0xe] = (uint)(uVar3 >> 0x3c) | (uVar2 & 0x3fff) << 4;
  out[0xf] = uVar2 >> 0xe;
  return in + 9;
}

Assistant:

const uint32_t *__fastunpack18_16(const uint32_t *__restrict__ in,
                                  uint32_t *__restrict__ out) {

  *out = ((*in) >> 0) % (1U << 18);
  out++;
  *out = ((*in) >> 18);
  ++in;
  *out |= ((*in) % (1U << 4)) << (18 - 4);
  out++;
  *out = ((*in) >> 4) % (1U << 18);
  out++;
  *out = ((*in) >> 22);
  ++in;
  *out |= ((*in) % (1U << 8)) << (18 - 8);
  out++;
  *out = ((*in) >> 8) % (1U << 18);
  out++;
  *out = ((*in) >> 26);
  ++in;
  *out |= ((*in) % (1U << 12)) << (18 - 12);
  out++;
  *out = ((*in) >> 12) % (1U << 18);
  out++;
  *out = ((*in) >> 30);
  ++in;
  *out |= ((*in) % (1U << 16)) << (18 - 16);
  out++;
  *out = ((*in) >> 16);
  ++in;
  *out |= ((*in) % (1U << 2)) << (18 - 2);
  out++;
  *out = ((*in) >> 2) % (1U << 18);
  out++;
  *out = ((*in) >> 20);
  ++in;
  *out |= ((*in) % (1U << 6)) << (18 - 6);
  out++;
  *out = ((*in) >> 6) % (1U << 18);
  out++;
  *out = ((*in) >> 24);
  ++in;
  *out |= ((*in) % (1U << 10)) << (18 - 10);
  out++;
  *out = ((*in) >> 10) % (1U << 18);
  out++;
  *out = ((*in) >> 28);
  ++in;
  *out |= ((*in) % (1U << 14)) << (18 - 14);
  out++;
  *out = ((*in) >> 14);
  ++in;
  out++;

  return in;
}